

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O2

void render_pixel(BG_shift_registers *BG_regs,uint16_t scanline,uint16_t dot)

{
  byte bVar1;
  uint8_t uVar2;
  uint16_t address;
  undefined8 in_RAX;
  _Bool sprite_behind_bg;
  uint8_t sprite_pallete;
  _Bool sprite_is_sprite0;
  undefined2 local_23;
  _Bool local_21;
  
  local_23 = (ushort)((ulong)in_RAX >> 0x28);
  bVar1 = get_sprite_pixel((uint8_t *)((long)&local_23 + 1),(_Bool *)&local_23,&local_21,dot);
  if ((bVar1 == 0) || (local_23._0_1_ != false)) {
    uVar2 = get_fineX_scroll();
    address = (ushort)((BG_regs->low_background_shift >> ((byte)(0xf - uVar2) & 0x1f) & 1) != 0) +
              (ushort)((BG_regs->high_background_shift >> ((byte)(0xf - uVar2) & 0x1f) & 1) != 0) *
              2 + (ushort)((BG_regs->low_attribute_shift >> ((byte)(7 - uVar2) & 0x1f) & 1) != 0) *
                  4 + (ushort)((BG_regs->high_attribute_shift >> ((byte)(7 - uVar2) & 0x1f) & 1) !=
                              0) * 8 + 0x3f00;
  }
  else {
    address = (ushort)bVar1 | (local_23 >> 8) << 2 | 0x3f10;
  }
  bVar1 = read_VRAM(address);
  pixel_data[scanline][(ushort)(dot - 1)] = RGB_colors[bVar1];
  return;
}

Assistant:

void render_pixel(BG_shift_registers* BG_regs, uint16_t scanline, uint16_t dot) {
    // PPU is behind 2 pixels
    uint16_t pixel = dot - 1;
    uint8_t sprite_pallete;
    bool sprite_behind_bg;
    bool sprite_is_sprite0;
    uint8_t sprite_pattern = get_sprite_pixel(
        &sprite_pallete,
        &sprite_behind_bg,
        &sprite_is_sprite0,
        dot
    );

    uint16_t pallete_address;
    if(sprite_pattern && !sprite_behind_bg)
        pallete_address = 0x3F10 | (sprite_pallete << 2) | sprite_pattern;
    else
        pallete_address = get_pallete_address(BG_regs);

    uint16_t pallete_data = read_VRAM(pallete_address);
    // Cycle 0 is idle so we have to subtract 1 to get right dot
    pixel_data[scanline][pixel] = RGB_colors[pallete_data];
}